

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# class.h
# Opt level: O0

int pybind11_meta_setattro(PyObject *obj,PyObject *name,PyObject *value)

{
  PyTypeObject *pPVar1;
  int iVar2;
  long lVar3;
  internals *piVar4;
  bool bVar5;
  bool call_descr_set;
  PyObject *static_prop;
  PyObject *descr;
  PyObject *value_local;
  PyObject *name_local;
  PyObject *obj_local;
  
  lVar3 = _PyType_Lookup(obj,name);
  piVar4 = pybind11::detail::get_internals();
  pPVar1 = piVar4->static_property_type;
  bVar5 = false;
  if ((lVar3 != 0) && (bVar5 = false, value != (PyObject *)0x0)) {
    iVar2 = PyObject_IsInstance(lVar3,pPVar1);
    bVar5 = false;
    if (iVar2 != 0) {
      iVar2 = PyObject_IsInstance(value,pPVar1);
      bVar5 = iVar2 == 0;
    }
  }
  if (bVar5) {
    obj_local._4_4_ = (**(code **)(*(long *)(lVar3 + 8) + 0x118))(lVar3,obj,value);
  }
  else {
    obj_local._4_4_ = (*___cxa_free_exception)(obj,name,value);
  }
  return obj_local._4_4_;
}

Assistant:

inline int pybind11_meta_setattro(PyObject* obj, PyObject* name, PyObject* value) {
    // Use `_PyType_Lookup()` instead of `PyObject_GetAttr()` in order to get the raw
    // descriptor (`property`) instead of calling `tp_descr_get` (`property.__get__()`).
    PyObject *descr = _PyType_Lookup((PyTypeObject *) obj, name);

    // The following assignment combinations are possible:
    //   1. `Type.static_prop = value`             --> descr_set: `Type.static_prop.__set__(value)`
    //   2. `Type.static_prop = other_static_prop` --> setattro:  replace existing `static_prop`
    //   3. `Type.regular_attribute = value`       --> setattro:  regular attribute assignment
    const auto static_prop = (PyObject *) get_internals().static_property_type;
    const auto call_descr_set = descr && value && PyObject_IsInstance(descr, static_prop)
                                && !PyObject_IsInstance(value, static_prop);
    if (call_descr_set) {
        // Call `static_property.__set__()` instead of replacing the `static_property`.
#if !defined(PYPY_VERSION)
        return Py_TYPE(descr)->tp_descr_set(descr, obj, value);
#else
        if (PyObject *result = PyObject_CallMethod(descr, "__set__", "OO", obj, value)) {
            Py_DECREF(result);
            return 0;
        } else {
            return -1;
        }
#endif
    } else {
        // Replace existing attribute.
        return PyType_Type.tp_setattro(obj, name, value);
    }
}